

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.h
# Opt level: O2

Float __thiscall pbrt::GaussianFilter::Evaluate(GaussianFilter *this,Point2f *p)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Float FVar3;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar4 [64];
  undefined1 extraout_var [60];
  
  FVar3 = Gaussian((p->super_Tuple2<pbrt::Point2,_float>).x,0.0,this->sigma);
  auVar2._0_4_ = this->expX;
  auVar2._4_4_ = this->expY;
  auVar2._8_4_ = *(undefined4 *)&this->field_0x14;
  auVar2._12_4_ = (this->sampler).domain.pMin.super_Tuple2<pbrt::Point2,_float>.x;
  auVar4._0_4_ = Gaussian((p->super_Tuple2<pbrt::Point2,_float>).y,0.0,this->sigma);
  auVar4._4_60_ = extraout_var;
  auVar1._4_4_ = extraout_XMM0_Db;
  auVar1._0_4_ = FVar3;
  auVar1._8_4_ = extraout_XMM0_Dc;
  auVar1._12_4_ = extraout_XMM0_Dd;
  auVar1 = vinsertps_avx(auVar1,auVar4._0_16_,0x10);
  auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)this->expY),0x10);
  auVar1 = vsubps_avx(auVar1,auVar2);
  auVar1 = vmaxps_avx(auVar1,ZEXT816(0) << 0x20);
  auVar2 = vmovshdup_avx(auVar1);
  return auVar1._0_4_ * auVar2._0_4_;
}

Assistant:

PBRT_CPU_GPU
    Float Evaluate(const Point2f &p) const {
        return (std::max<Float>(0, Gaussian(p.x, 0, sigma) - expX) *
                std::max<Float>(0, Gaussian(p.y, 0, sigma) - expY));
    }